

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O2

void __thiscall HighsIis::addRow(HighsIis *this,HighsInt row,HighsInt status)

{
  HighsInt local_18;
  HighsInt local_14;
  
  _local_18 = CONCAT44(row,status);
  std::vector<int,_std::allocator<int>_>::push_back(&this->row_index_,&local_14);
  std::vector<int,_std::allocator<int>_>::push_back(&this->row_bound_,&local_18);
  return;
}

Assistant:

void HighsIis::addRow(const HighsInt row, const HighsInt status) {
  this->row_index_.push_back(row);
  this->row_bound_.push_back(status);
}